

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strencodings.h
# Opt level: O0

char LocaleIndependentAtoi<signed_char>(string_view str)

{
  long lVar1;
  string_view str_00;
  bool bVar2;
  const_reference pvVar3;
  size_type sVar4;
  basic_string_view<char,_std::char_traits<char>_> *this;
  long in_FS_OFFSET;
  __integer_from_chars_result_type<signed_char> _Var5;
  char *_;
  string_view s;
  char result;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff68;
  undefined7 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff77;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff78;
  char *in_stack_ffffffffffffff80;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff88;
  int __base;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9f;
  string_view in_stack_ffffffffffffffa0;
  size_t in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  char local_19;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  str_00._M_str = in_stack_ffffffffffffffb8;
  str_00._M_len = in_stack_ffffffffffffffb0;
  util::TrimStringView(str_00,in_stack_ffffffffffffffa0);
  bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::empty(in_stack_ffffffffffffff68);
  if ((!bVar2) &&
     (pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                         (in_stack_ffffffffffffff78,
                          CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70)),
     *pvVar3 == '+')) {
    sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::length(in_stack_ffffffffffffff68)
    ;
    if ((1 < sVar4) &&
       (pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                           (in_stack_ffffffffffffff78,
                            CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70)),
       *pvVar3 == '-')) {
      local_19 = '\0';
      goto LAB_00c99c6b;
    }
    std::basic_string_view<char,_std::char_traits<char>_>::substr
              (in_stack_ffffffffffffff88,(size_type)in_stack_ffffffffffffff80,
               CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
  }
  __base = (int)((ulong)in_stack_ffffffffffffff88 >> 0x20);
  std::basic_string_view<char,_std::char_traits<char>_>::data(in_stack_ffffffffffffff68);
  this = (basic_string_view<char,_std::char_traits<char>_> *)
         std::basic_string_view<char,_std::char_traits<char>_>::data(in_stack_ffffffffffffff68);
  std::basic_string_view<char,_std::char_traits<char>_>::size(in_stack_ffffffffffffff68);
  _Var5 = std::from_chars<signed_char>
                    (in_stack_ffffffffffffffb8,
                     (char *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98),
                     (char *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),__base);
  if (_Var5.ec == result_out_of_range) {
    sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::length(in_stack_ffffffffffffff68)
    ;
    if ((sVar4 == 0) ||
       (pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                           (this,CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70)),
       *pvVar3 != '-')) {
      local_19 = std::numeric_limits<signed_char>::max();
    }
    else {
      local_19 = std::numeric_limits<signed_char>::min();
    }
  }
  else if (_Var5.ec != 0) {
    local_19 = '\0';
  }
LAB_00c99c6b:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_19;
}

Assistant:

T LocaleIndependentAtoi(std::string_view str)
{
    static_assert(std::is_integral<T>::value);
    T result;
    // Emulate atoi(...) handling of white space and leading +/-.
    std::string_view s = util::TrimStringView(str);
    if (!s.empty() && s[0] == '+') {
        if (s.length() >= 2 && s[1] == '-') {
            return 0;
        }
        s = s.substr(1);
    }
    auto [_, error_condition] = std::from_chars(s.data(), s.data() + s.size(), result);
    if (error_condition == std::errc::result_out_of_range) {
        if (s.length() >= 1 && s[0] == '-') {
            // Saturate underflow, per strtoll's behavior.
            return std::numeric_limits<T>::min();
        } else {
            // Saturate overflow, per strtoll's behavior.
            return std::numeric_limits<T>::max();
        }
    } else if (error_condition != std::errc{}) {
        return 0;
    }
    return result;
}